

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

void __thiscall dtc::fdt::device_tree::resolve_cross_references(device_tree *this,uint32_t *phandle)

{
  pointer pppVar1;
  property_value *ppVar2;
  __shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  pointer prVar5;
  __type _Var6;
  bool bVar7;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__x;
  __shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  pointer pppVar9;
  pointer __x_00;
  byte_buffer *this_00;
  pointer ppVar10;
  int iVar12;
  fixup *i;
  pointer ppVar13;
  node_ptr target;
  string path_1;
  node_ptr next;
  string node_address;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
  *local_458;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_450;
  __shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2> *local_448;
  uint32_t *local_440;
  string path_element;
  string possible;
  string target_name;
  vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
  sorted_phandles;
  __shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2> local_3b8;
  string node_name;
  _Any_data local_388;
  code *local_378;
  code *local_370;
  unordered_map<dtc::fdt::property_value_*,_dtc::fdt::device_tree::fixup_&,_std::hash<dtc::fdt::property_value_*>,_std::equal_to<dtc::fdt::property_value_*>,_std::allocator<std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>_>_>
  phandle_set;
  node_path path;
  byte abStack_310 [352];
  istringstream nss;
  pointer ppVar11;
  
  pppVar1 = (this->cross_references).
            super__Vector_base<dtc::fdt::property_value_*,_std::allocator<dtc::fdt::property_value_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_440 = phandle;
  for (pppVar9 = (this->cross_references).
                 super__Vector_base<dtc::fdt::property_value_*,_std::allocator<dtc::fdt::property_value_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; pppVar9 != pppVar1;
      pppVar9 = pppVar9 + 1) {
    ppVar2 = *pppVar9;
    __x = &std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->node_paths,&ppVar2->string_data)->
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&path.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ,__x);
    ppVar13 = path.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (path.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        path.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = &ppVar2->byte_data;
      ppVar10 = path.
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      while (ppVar11 = ppVar10, ppVar10 = ppVar11 + 1, ppVar10 != ppVar13) {
        nss = (istringstream)0x2f;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (this_00,(uchar *)&nss);
        push_string(this_00,&ppVar10->first,false);
        if (ppVar11[1].second._M_string_length != 0) {
          nss = (istringstream)0x40;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (this_00,(uchar *)&nss);
          push_string(this_00,&ppVar11[1].second,false);
        }
      }
      nss = (istringstream)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (this_00,(uchar *)&nss);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&path.
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             );
  }
  phandle_set._M_h._M_buckets = &phandle_set._M_h._M_single_bucket;
  phandle_set._M_h._M_bucket_count = 1;
  phandle_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  phandle_set._M_h._M_element_count = 0;
  phandle_set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  phandle_set._M_h._M_rehash_policy._M_next_resize = 0;
  phandle_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ppVar10 = (pointer)(this->fixups).
                     super__Vector_base<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar13 = (pointer)(this->fixups).
                          super__Vector_base<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppVar13 != ppVar10;
      ppVar13 = (pointer)&(ppVar13->second).field_2) {
    path.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(ppVar13->second)._M_string_length;
    path.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar13;
    std::
    _Hashtable<dtc::fdt::property_value*,std::pair<dtc::fdt::property_value*const,dtc::fdt::device_tree::fixup&>,std::allocator<std::pair<dtc::fdt::property_value*const,dtc::fdt::device_tree::fixup&>>,std::__detail::_Select1st,std::equal_to<dtc::fdt::property_value*>,std::hash<dtc::fdt::property_value*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<dtc::fdt::property_value*const,dtc::fdt::device_tree::fixup&>>
              ((_Hashtable<dtc::fdt::property_value*,std::pair<dtc::fdt::property_value*const,dtc::fdt::device_tree::fixup&>,std::allocator<std::pair<dtc::fdt::property_value*const,dtc::fdt::device_tree::fixup&>>,std::__detail::_Select1st,std::equal_to<dtc::fdt::property_value*>,std::hash<dtc::fdt::property_value*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&phandle_set,&path);
  }
  local_388._8_8_ = &sorted_phandles;
  sorted_phandles.
  super__Vector_base<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sorted_phandles.
  super__Vector_base<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sorted_phandles.
  super__Vector_base<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_370 = std::
              _Function_handler<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc:1406:14)>
              ::_M_invoke;
  local_378 = std::
              _Function_handler<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc:1406:14)>
              ::_M_manager;
  local_388._M_unused._M_object =
       (_Hashtable<dtc::fdt::property_value*,std::pair<dtc::fdt::property_value*const,dtc::fdt::device_tree::fixup&>,std::allocator<std::pair<dtc::fdt::property_value*const,dtc::fdt::device_tree::fixup&>>,std::__detail::_Select1st,std::equal_to<dtc::fdt::property_value*>,std::hash<dtc::fdt::property_value*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        *)&phandle_set;
  node::visit((this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
              (function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)> *)
              &local_388,(node *)0x0);
  std::_Function_base::~_Function_base((_Function_base *)&local_388);
  prVar5 = sorted_phandles.
           super__Vector_base<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)sorted_phandles.
            super__Vector_base<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)sorted_phandles.
            super__Vector_base<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 !=
      ((long)(this->fixups).
             super__Vector_base<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>
             ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->fixups).
            super__Vector_base<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>
            ._M_impl.super__Vector_impl_data._M_start) / 0x30) {
    __assert_fail("sorted_phandles.size() == fixups.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",
                  0x58d,"void dtc::fdt::device_tree::resolve_cross_references(uint32_t &)");
  }
  local_448 = &(this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>;
  local_450 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&this->node_names;
  local_458 = &this->unresolved_fixups;
  __x_00 = sorted_phandles.
           super__Vector_base<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (__x_00 == prVar5) break;
    std::__cxx11::string::string
              ((string *)&target_name,(string *)&__x_00->_M_data->val->string_data);
    target.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    target.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    possible._M_dataplus._M_p = (pointer)&possible.field_2;
    possible._M_string_length = 0;
    possible.field_2._M_local_buf[0] = '\0';
    if (*target_name._M_dataplus._M_p == '/') {
      path_1._M_dataplus._M_p = (pointer)&path_1.field_2;
      path_1._M_string_length = 0;
      path_1.field_2._M_local_buf[0] = '\0';
      std::__shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&target.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>,local_448);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&path,(string *)&target_name,_S_in);
      path_element._M_dataplus._M_p = (pointer)&path_element.field_2;
      path_element._M_string_length = 0;
      path_element.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&path,(string *)&path_element,'/');
      do {
        if ((abStack_310
             [path.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[-1].second._M_string_length] & 2) != 0)
        break;
        std::__cxx11::string::push_back((char)&path_1);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&path,(string *)&path_element,'/');
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&nss,(string *)&path_element,_S_in);
        node_name._M_dataplus._M_p = (pointer)&node_name.field_2;
        node_name._M_string_length = 0;
        node_name.field_2._M_local_buf[0] = '\0';
        node_address._M_dataplus._M_p = (pointer)&node_address.field_2;
        node_address._M_string_length = 0;
        node_address.field_2._M_local_buf[0] = '\0';
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&nss,(string *)&node_name,'@');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&nss,(string *)&node_address,'@');
        next.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        next.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var3 = &(((target.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   children).
                   super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                  super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>;
        for (p_Var8 = &(((target.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->children).
                        super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>;
            p_Var8 != p_Var3; p_Var8 = p_Var8 + 1) {
          _Var6 = std::operator==(&p_Var8->_M_ptr->name,&node_name);
          if (_Var6) {
            _Var6 = std::operator==(&p_Var8->_M_ptr->unit_address,&node_address);
            if (_Var6) {
              std::__shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>::operator=
                        (&next.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>,p_Var8
                        );
              break;
            }
            std::operator+(&local_478,&path_1,&p_Var8->_M_ptr->name);
            std::__cxx11::string::operator=((string *)&possible,(string *)&local_478);
            std::__cxx11::string::~string((string *)&local_478);
            local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
            local_478._M_string_length = 0;
            local_478.field_2._M_local_buf[0] = '\0';
            bVar7 = std::operator!=(&p_Var8->_M_ptr->unit_address,&local_478);
            std::__cxx11::string::~string((string *)&local_478);
            if (bVar7) {
              std::__cxx11::string::push_back((char)&possible);
              std::__cxx11::string::append((string *)&possible);
            }
          }
        }
        std::__cxx11::string::append((string *)&path_1);
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        local_478._M_string_length = 0;
        local_478.field_2._M_local_buf[0] = '\0';
        bVar7 = std::operator!=(&node_address,&local_478);
        std::__cxx11::string::~string((string *)&local_478);
        if (bVar7) {
          std::__cxx11::string::push_back((char)&path_1);
          std::__cxx11::string::append((string *)&path_1);
        }
        std::__shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&target.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>,
                   &next.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>);
        peVar4 = target.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&next.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        std::__cxx11::string::~string((string *)&node_address);
        std::__cxx11::string::~string((string *)&node_name);
        std::__cxx11::istringstream::~istringstream((istringstream *)&nss);
      } while (peVar4 != (element_type *)0x0);
      std::__cxx11::string::~string((string *)&path_element);
      std::__cxx11::istringstream::~istringstream((istringstream *)&path);
      std::__cxx11::string::~string((string *)&path_1);
    }
    else {
      p_Var8 = &std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[](local_450,&target_name)->
                super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&target.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>,p_Var8);
    }
    if (target.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (this->is_plugin == true) {
        std::
        vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
        ::push_back(local_458,__x_00);
        iVar12 = 10;
      }
      else {
        fprintf(_stderr,"Failed to find node with label: %s\n",target_name._M_dataplus._M_p);
        path.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&path.
                       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        path.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        path.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        bVar7 = std::operator!=(&possible,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&path);
        std::__cxx11::string::~string((string *)&path);
        if (bVar7) {
          fprintf(_stderr,"Possible intended match: %s\n",possible._M_dataplus._M_p);
        }
        this->valid = false;
        iVar12 = 1;
      }
    }
    else {
      std::__shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_3b8,&target.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>);
      assign_phandle((device_tree *)&path,(node_ptr *)this,(uint32_t *)&local_3b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3b8._M_refcount);
      property_value::push_to_buffer
                (*(property_value **)
                  ((long)&path.
                          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          .
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].first.field_2 + 8),
                 &__x_00->_M_data->val->byte_data);
      ppVar2 = __x_00->_M_data->val;
      if ((long)(ppVar2->byte_data).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(ppVar2->byte_data).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 4) {
        __assert_fail("i.get().val.byte_data.size() == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc"
                      ,0x5e1,"void dtc::fdt::device_tree::resolve_cross_references(uint32_t &)");
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &path.
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  .
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      iVar12 = 0;
    }
    std::__cxx11::string::~string((string *)&possible);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&target.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&target_name);
    if ((iVar12 != 10) && (iVar12 != 0)) break;
    __x_00 = __x_00 + 1;
  }
  std::
  _Vector_base<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
  ::~_Vector_base(&sorted_phandles.
                   super__Vector_base<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
                 );
  std::
  _Hashtable<dtc::fdt::property_value_*,_std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>,_std::allocator<std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>_>,_std::__detail::_Select1st,_std::equal_to<dtc::fdt::property_value_*>,_std::hash<dtc::fdt::property_value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&phandle_set._M_h);
  return;
}

Assistant:

void
device_tree::resolve_cross_references(uint32_t &phandle)
{
	for (auto *pv : cross_references)
	{
		node_path path = node_paths[pv->string_data];
		auto p = path.begin();
		auto pe = path.end();
		if (p != pe)
		{
			// Skip the first name in the path.  It's always "", and implicitly /
			for (++p ; p!=pe ; ++p)
			{
				pv->byte_data.push_back('/');
				push_string(pv->byte_data, p->first);
				if (!(p->second.empty()))
				{
					pv->byte_data.push_back('@');
					push_string(pv->byte_data, p->second);
				}
			}
			pv->byte_data.push_back(0);
		}
	}
	std::unordered_map<property_value*, fixup&> phandle_set;
	for (auto &i : fixups)
	{
		phandle_set.insert({&i.val, i});
	}
	std::vector<std::reference_wrapper<fixup>> sorted_phandles;
	root->visit([&](node &n, node *) {
		for (auto &p : n.properties())
		{
			for (auto &v : *p)
			{
				auto i = phandle_set.find(&v);
				if (i != phandle_set.end())
				{
					sorted_phandles.push_back(i->second);
				}
			}
		}
		// Allow recursion
		return node::VISIT_RECURSE;
	}, nullptr);
	assert(sorted_phandles.size() == fixups.size());
	for (auto &i : sorted_phandles)
	{
		string target_name = i.get().val.string_data;
		node_ptr target;
		string possible;
		// If the node name is a path, then look it up by following the path,
		// otherwise jump directly to the named node.
		if (target_name[0] == '/')
		{
			string path;
			target = root;
			std::istringstream ss(target_name);
			string path_element;
			// Read the leading /
			std::getline(ss, path_element, '/');
			// Iterate over path elements
			while (!ss.eof())
			{
				path += '/';
				std::getline(ss, path_element, '/');
				std::istringstream nss(path_element);
				string node_name, node_address;
				std::getline(nss, node_name, '@');
				std::getline(nss, node_address, '@');
				node_ptr next;
				for (auto &c : target->child_nodes())
				{
					if (c->name == node_name)
					{
						if (c->unit_address == node_address)
						{
							next = c;
							break;
						}
						else
						{
							possible = path + c->name;
							if (c->unit_address != string())
							{
								possible += '@';
								possible += c->unit_address;
							}
						}
					}
				}
				path += node_name;
				if (node_address != string())
				{
					path += '@';
					path += node_address;
				}
				target = next;
				if (target == nullptr)
				{
					break;
				}
			}
		}
		else
		{
			target = node_names[target_name];
		}
		if (target == nullptr)
		{
			if (is_plugin)
			{
				unresolved_fixups.push_back(i);
				continue;
			}
			else
			{
				fprintf(stderr, "Failed to find node with label: %s\n", target_name.c_str());
				if (possible != string())
				{
					fprintf(stderr, "Possible intended match: %s\n", possible.c_str());
				}
				valid = 0;
				return;
			}
		}
		// If there is an existing phandle, use it
		property_ptr p = assign_phandle(target, phandle);
		p->begin()->push_to_buffer(i.get().val.byte_data);
		assert(i.get().val.byte_data.size() == 4);
	}
}